

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall VM::pop<int>(VM *this,int *out)

{
  StackFrame *pSVar1;
  
  pSVar1 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  rmstack(this);
  *out = *(int *)pSVar1->ptr;
  if (pSVar1->ptr != (uchar *)0x0) {
    operator_delete__(pSVar1->ptr);
  }
  operator_delete(pSVar1);
  return;
}

Assistant:

void pop(T& out) {
    StackFrame* frame = stack.back();
    rmstack();
    memcpy(&out,frame->ptr,sizeof(T));
    delete frame;
  }